

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::EnumColumnWriter::FlushDictionary
          (EnumColumnWriter *this,PrimitiveColumnWriterState *state,ColumnWriterStatistics *stats_p)

{
  Vector *pVVar1;
  idx_t iVar2;
  Allocator *allocator_p;
  MemoryStream *this_00;
  pointer pMVar3;
  pointer *__ptr;
  char *pcVar4;
  string_t *val;
  templated_unique_single_t temp_writer;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> local_58;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> local_50;
  uint32_t local_44;
  idx_t local_40;
  PrimitiveColumnWriterState *local_38;
  
  local_38 = state;
  pVVar1 = EnumType::GetValuesInsertOrder((LogicalType *)(*(long *)&this->field_0x10 + 0x28));
  iVar2 = EnumType::GetSize((LogicalType *)(*(long *)&this->field_0x10 + 0x28));
  val = (string_t *)pVVar1->data;
  allocator_p = Allocator::Get((ClientContext *)**(undefined8 **)&this->field_0x8);
  this_00 = (MemoryStream *)operator_new(0x30);
  MemoryStream::MemoryStream(this_00,allocator_p,0x200);
  local_58._M_head_impl = this_00;
  local_40 = iVar2;
  if (iVar2 != 0) {
    do {
      StringStatisticsState::Update((StringStatisticsState *)stats_p,val);
      pMVar3 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
               operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                           *)&local_58);
      local_44 = (val->value).pointer.length;
      (**(pMVar3->super_WriteStream)._vptr_WriteStream)(pMVar3,&local_44,4);
      pMVar3 = unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>::
               operator->((unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true>
                           *)&local_58);
      if ((val->value).pointer.length < 0xd) {
        pcVar4 = (char *)((long)&val->value + 4);
      }
      else {
        pcVar4 = (val->value).pointer.ptr;
      }
      (**(pMVar3->super_WriteStream)._vptr_WriteStream)(pMVar3,pcVar4);
      val = val + 1;
      iVar2 = iVar2 - 1;
    } while (iVar2 != 0);
  }
  local_50._M_head_impl = local_58._M_head_impl;
  local_58._M_head_impl = (MemoryStream *)0x0;
  PrimitiveColumnWriter::WriteDictionary
            ((PrimitiveColumnWriter *)this,local_38,
             (unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true> *)
             &local_50,local_40);
  if (local_50._M_head_impl != (MemoryStream *)0x0) {
    (*((local_50._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
  }
  local_50._M_head_impl = (MemoryStream *)0x0;
  if (local_58._M_head_impl != (MemoryStream *)0x0) {
    (*((local_58._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
  }
  return;
}

Assistant:

void EnumColumnWriter::FlushDictionary(PrimitiveColumnWriterState &state, ColumnWriterStatistics *stats_p) {
	auto &stats = stats_p->Cast<StringStatisticsState>();
	// write the enum values to a dictionary page
	auto &enum_values = EnumType::GetValuesInsertOrder(Type());
	auto enum_count = EnumType::GetSize(Type());
	auto string_values = FlatVector::GetData<string_t>(enum_values);
	// first write the contents of the dictionary page to a temporary buffer
	auto temp_writer = make_uniq<MemoryStream>(Allocator::Get(writer.GetContext()));
	for (idx_t r = 0; r < enum_count; r++) {
		D_ASSERT(!FlatVector::IsNull(enum_values, r));
		// update the statistics
		stats.Update(string_values[r]);
		// write this string value to the dictionary
		temp_writer->Write<uint32_t>(string_values[r].GetSize());
		temp_writer->WriteData(const_data_ptr_cast(string_values[r].GetData()), string_values[r].GetSize());
	}
	// flush the dictionary page and add it to the to-be-written pages
	WriteDictionary(state, std::move(temp_writer), enum_count);
}